

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error t1_builder_start_point(T1_Builder builder,FT_Pos x,FT_Pos y)

{
  FT_Error local_24;
  FT_Error error;
  FT_Pos y_local;
  FT_Pos x_local;
  T1_Builder builder_local;
  
  if (builder->parse_state == T1_Parse_Have_Path) {
    local_24 = 0;
  }
  else {
    builder->parse_state = T1_Parse_Have_Path;
    local_24 = t1_builder_add_contour(builder);
    if (local_24 == 0) {
      local_24 = t1_builder_add_point1(builder,x,y);
    }
  }
  return local_24;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_builder_start_point( T1_Builder  builder,
                          FT_Pos      x,
                          FT_Pos      y )
  {
    FT_Error  error = FT_ERR( Invalid_File_Format );


    /* test whether we are building a new contour */

    if ( builder->parse_state == T1_Parse_Have_Path )
      error = FT_Err_Ok;
    else
    {
      builder->parse_state = T1_Parse_Have_Path;
      error = t1_builder_add_contour( builder );
      if ( !error )
        error = t1_builder_add_point1( builder, x, y );
    }

    return error;
  }